

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FDrawInfo_*,_FDrawInfo_*>::~TDeletingArray
          (TDeletingArray<FDrawInfo_*,_FDrawInfo_*> *this)

{
  FDrawInfo *this_00;
  uint uVar1;
  FDrawInfo **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FDrawInfo_*,_FDrawInfo_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FDrawInfo_*,_FDrawInfo_*>::Size(&this->super_TArray<FDrawInfo_*,_FDrawInfo_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FDrawInfo_*,_FDrawInfo_*>::operator[]
                        (&this->super_TArray<FDrawInfo_*,_FDrawInfo_*>,(ulong)local_14);
    if (*ppFVar2 != (FDrawInfo *)0x0) {
      ppFVar2 = TArray<FDrawInfo_*,_FDrawInfo_*>::operator[]
                          (&this->super_TArray<FDrawInfo_*,_FDrawInfo_*>,(ulong)local_14);
      this_00 = *ppFVar2;
      if (this_00 != (FDrawInfo *)0x0) {
        FDrawInfo::~FDrawInfo(this_00);
        operator_delete(this_00,0x3a8);
      }
    }
  }
  TArray<FDrawInfo_*,_FDrawInfo_*>::~TArray(&this->super_TArray<FDrawInfo_*,_FDrawInfo_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}